

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O3

void __thiscall Fl_Group::draw_children(Fl_Group *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Widget *widget;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Graphics_Driver *this_00;
  Fl_Widget ***pppFVar9;
  long lVar10;
  
  if (this->children_ < 2) {
    pppFVar9 = &this->array_;
  }
  else {
    pppFVar9 = (Fl_Widget ***)this->array_;
  }
  this_00 = (Fl_Graphics_Driver *)this;
  if (((this->super_Fl_Widget).flags_ & 0x800) != 0) {
    iVar1 = (this->super_Fl_Widget).x_;
    iVar5 = Fl::box_dx((uint)(this->super_Fl_Widget).box_);
    iVar2 = (this->super_Fl_Widget).y_;
    iVar6 = Fl::box_dy((uint)(this->super_Fl_Widget).box_);
    iVar3 = (this->super_Fl_Widget).w_;
    iVar7 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
    iVar4 = (this->super_Fl_Widget).h_;
    iVar8 = Fl::box_dh((uint)(this->super_Fl_Widget).box_);
    this_00 = fl_graphics_driver;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)(iVar1 + iVar5),(ulong)(uint)(iVar2 + iVar6),
               (ulong)(uint)(iVar3 - iVar7),(ulong)(uint)(iVar4 - iVar8));
  }
  iVar1 = this->children_;
  if ((this->super_Fl_Widget).damage_ < 2) {
    if (iVar1 != 0) {
      lVar10 = 0;
      do {
        update_child((Fl_Group *)this_00,(Fl_Widget *)pppFVar9[lVar10]);
        lVar10 = lVar10 + 1;
      } while (iVar1 != (int)lVar10);
    }
  }
  else if (iVar1 != 0) {
    lVar10 = 0;
    do {
      widget = (Fl_Widget *)pppFVar9[lVar10];
      draw_child((Fl_Group *)this_00,widget);
      this_00 = (Fl_Graphics_Driver *)this;
      draw_outside_label(this,widget);
      lVar10 = lVar10 + 1;
    } while (iVar1 != (int)lVar10);
  }
  if (((this->super_Fl_Widget).flags_ & 0x800) != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    return;
  }
  return;
}

Assistant:

void Fl_Group::draw_children() {
  Fl_Widget*const* a = array();

  if (clip_children()) {
    fl_push_clip(x() + Fl::box_dx(box()),
                 y() + Fl::box_dy(box()),
		 w() - Fl::box_dw(box()),
		 h() - Fl::box_dh(box()));
  }

  if (damage() & ~FL_DAMAGE_CHILD) { // redraw the entire thing:
    for (int i=children_; i--;) {
      Fl_Widget& o = **a++;
      draw_child(o);
      draw_outside_label(o);
    }
  } else {	// only redraw the children that need it:
    for (int i=children_; i--;) update_child(**a++);
  }

  if (clip_children()) fl_pop_clip();
}